

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_1bd9642::HandleSourceMode
               (cmExecutionStatus *status,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,string *propertyName,string *propertyValue,bool appendAsString,bool appendMode
               ,bool remove,vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *directory_makefiles
               ,bool source_file_paths_should_be_absolute)

{
  cmMakefile *this;
  pointer pbVar1;
  int iVar2;
  cmSourceFile *sf;
  PropertyOp op_00;
  pointer sourceName;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  PropertyOp op;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files_absolute;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique_files;
  bool local_e5;
  pointer local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  pointer local_a8;
  string *local_a0;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
             (names->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&(names->_M_t)._M_impl.super__Rb_tree_header,(allocator_type *)&local_60);
  SetPropertyCommand::MakeSourceFilePathsAbsoluteIfNeeded
            (status,&local_c8,
             (const_iterator)
             local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (const_iterator)
             local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,source_file_paths_should_be_absolute);
  local_e0 = (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  local_a8 = (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  local_e5 = local_e0 == local_a8;
  if (!local_e5) {
    op_00 = AppendAsString;
    if (!appendAsString) {
      op_00 = appendMode + Set;
    }
    if (remove) {
      op_00 = Remove;
    }
    local_a0 = (string *)&status->Error;
    do {
      pbVar1 = local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        this = *local_e0;
        sourceName = local_c8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        do {
          sf = cmMakefile::GetOrCreateSource(this,sourceName,false,Ambiguous);
          if (sf == (cmSourceFile *)0x0) {
            local_60.first._M_len = 0x36;
            local_60.first._M_str = "given SOURCE name that could not be found or created: ";
            local_60.second =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_40 = (sourceName->_M_dataplus)._M_p;
            local_48 = sourceName->_M_string_length;
            local_38 = 0;
            views._M_len = 2;
            views._M_array = &local_60;
            cmCatViews(&local_98,views);
            std::__cxx11::string::_M_assign(local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)propertyName);
            if (iVar2 == 0) {
              SetPropertyCommand::HandleAndValidateSourceFilePropertyGENERATED
                        (sf,propertyValue,op_00);
            }
            else if (appendMode) {
              cmSourceFile::AppendProperty(sf,propertyName,propertyValue,appendAsString);
            }
            else if (remove) {
              cmSourceFile::SetProperty(sf,propertyName,(cmValue)0x0);
            }
            else {
              cmSourceFile::SetProperty(sf,propertyName,(cmValue)propertyValue);
            }
          }
          if (sf == (cmSourceFile *)0x0) goto LAB_004b352c;
          sourceName = sourceName + 1;
        } while (sourceName != pbVar1);
      }
      local_e0 = local_e0 + 1;
      local_e5 = local_e0 == local_a8;
    } while (!local_e5);
  }
LAB_004b352c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return local_e5;
}

Assistant:

bool HandleSourceMode(cmExecutionStatus& status,
                      const std::set<std::string>& names,
                      const std::string& propertyName,
                      const std::string& propertyValue, bool appendAsString,
                      bool appendMode, bool remove,
                      const std::vector<cmMakefile*>& directory_makefiles,
                      const bool source_file_paths_should_be_absolute)
{
  std::vector<std::string> files_absolute;
  std::vector<std::string> unique_files(names.begin(), names.end());
  SetPropertyCommand::MakeSourceFilePathsAbsoluteIfNeeded(
    status, files_absolute, unique_files.begin(), unique_files.end(),
    source_file_paths_should_be_absolute);

  for (auto* const mf : directory_makefiles) {
    for (std::string const& name : files_absolute) {
      // Get the source file.
      if (cmSourceFile* sf = mf->GetOrCreateSource(name)) {
        if (!HandleSource(sf, propertyName, propertyValue, appendAsString,
                          appendMode, remove)) {
          return false;
        }
      } else {
        status.SetError(cmStrCat(
          "given SOURCE name that could not be found or created: ", name));
        return false;
      }
    }
  }

  return true;
}